

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O0

bool __thiscall QAbstractScrollArea::eventFilter(QAbstractScrollArea *this,QObject *o,QEvent *e)

{
  byte bVar1;
  Type TVar2;
  int iVar3;
  QAbstractScrollAreaPrivate *this_00;
  QStyle *pQVar4;
  QEvent *in_RDX;
  QEvent *in_RSI;
  QObject *in_RDI;
  QScrollBar *sibling;
  QScrollBar *sbar;
  QAbstractScrollAreaPrivate *d;
  QWidget *in_stack_ffffffffffffffa8;
  QScrollBar *local_40;
  
  this_00 = d_func((QAbstractScrollArea *)0x4982f6);
  if ((((in_RSI == (QEvent *)this_00->hbar) || (in_RSI == (QEvent *)this_00->vbar)) &&
      ((TVar2 = QEvent::type(in_RDX), TVar2 == HoverEnter ||
       (TVar2 = QEvent::type(in_RDX), TVar2 == HoverLeave)))) &&
     ((this_00->hbarpolicy == ScrollBarAsNeeded && (this_00->vbarpolicy == ScrollBarAsNeeded)))) {
    if (in_RSI == (QEvent *)this_00->hbar) {
      local_40 = this_00->vbar;
    }
    else {
      local_40 = this_00->hbar;
    }
    pQVar4 = QWidget::style(in_stack_ffffffffffffffa8);
    iVar3 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x60,0,in_RSI);
    if (iVar3 != 0) {
      pQVar4 = QWidget::style(in_stack_ffffffffffffffa8);
      iVar3 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x60,0,local_40);
      if (iVar3 != 0) {
        QEvent::type(in_RDX);
        QAbstractScrollAreaPrivate::setScrollBarTransient
                  (this_00,(QScrollBar *)in_stack_ffffffffffffffa8,false);
      }
    }
  }
  bVar1 = QObject::eventFilter(in_RDI,in_RSI);
  return (bool)(bVar1 & 1);
}

Assistant:

bool QAbstractScrollArea::eventFilter(QObject *o, QEvent *e)
{
    Q_D(QAbstractScrollArea);
    if ((o == d->hbar || o == d->vbar) && (e->type() == QEvent::HoverEnter || e->type() == QEvent::HoverLeave)) {
        if (d->hbarpolicy == Qt::ScrollBarAsNeeded && d->vbarpolicy == Qt::ScrollBarAsNeeded) {
            QScrollBar *sbar = static_cast<QScrollBar*>(o);
            QScrollBar *sibling = sbar == d->hbar ? d->vbar : d->hbar;
            if (sbar->style()->styleHint(QStyle::SH_ScrollBar_Transient, nullptr, sbar) &&
                    sibling->style()->styleHint(QStyle::SH_ScrollBar_Transient, nullptr, sibling))
                d->setScrollBarTransient(sibling, e->type() == QEvent::HoverLeave);
        }
    }
    return QFrame::eventFilter(o, e);
}